

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

plutovg_surface_t *
plutosvg_document_render_to_surface
          (plutosvg_document_t *document,char *id,int width,int height,
          plutovg_color_t *current_color,plutosvg_palette_func_t palette_func,void *closure)

{
  _Bool _Var1;
  plutovg_canvas_t *canvas_00;
  float fVar2;
  plutovg_canvas_t *canvas;
  plutovg_surface_t *surface;
  plutovg_rect_t extents;
  plutosvg_palette_func_t palette_func_local;
  plutovg_color_t *current_color_local;
  int height_local;
  int width_local;
  char *id_local;
  plutosvg_document_t *document_local;
  
  surface._0_4_ = 0.0;
  surface._4_4_ = 0.0;
  extents.x = document->width;
  extents.y = document->height;
  extents._8_8_ = palette_func;
  if ((id == (char *)0x0) ||
     (_Var1 = plutosvg_document_extents(document,id,(plutovg_rect_t *)&surface), _Var1)) {
    if ((extents.x <= 0.0) || (extents.y <= 0.0)) {
      document_local = (plutosvg_document_t *)0x0;
    }
    else {
      if ((width < 1) && (height < 1)) {
        fVar2 = ceilf(extents.x);
        current_color_local._4_4_ = (int)fVar2;
        fVar2 = ceilf(extents.y);
        current_color_local._0_4_ = (int)fVar2;
      }
      else {
        current_color_local._4_4_ = width;
        if ((width < 1) || (0 < height)) {
          current_color_local._0_4_ = height;
          if ((0 < height) && (width < 1)) {
            fVar2 = ceilf(((float)height * extents.x) / extents.y);
            current_color_local._4_4_ = (int)fVar2;
          }
        }
        else {
          fVar2 = ceilf(((float)width * extents.y) / extents.x);
          current_color_local._0_4_ = (int)fVar2;
        }
      }
      document_local =
           (plutosvg_document_t *)
           plutovg_surface_create(current_color_local._4_4_,(int)current_color_local);
      if (document_local == (plutosvg_document_t *)0x0) {
        document_local = (plutosvg_document_t *)0x0;
      }
      else {
        canvas_00 = plutovg_canvas_create((plutovg_surface_t *)document_local);
        plutovg_canvas_scale
                  (canvas_00,(float)current_color_local._4_4_ / extents.x,
                   (float)(int)current_color_local / extents.y);
        plutovg_canvas_translate(canvas_00,-surface._0_4_,-surface._4_4_);
        _Var1 = plutosvg_document_render
                          (document,id,canvas_00,current_color,
                           (plutosvg_palette_func_t)extents._8_8_,closure);
        if (_Var1) {
          plutovg_canvas_destroy(canvas_00);
        }
        else {
          plutovg_canvas_destroy(canvas_00);
          plutovg_surface_destroy((plutovg_surface_t *)document_local);
          document_local = (plutosvg_document_t *)0x0;
        }
      }
    }
  }
  else {
    document_local = (plutosvg_document_t *)0x0;
  }
  return (plutovg_surface_t *)document_local;
}

Assistant:

plutovg_surface_t* plutosvg_document_render_to_surface(const plutosvg_document_t* document, const char* id, int width, int height, const plutovg_color_t* current_color, plutosvg_palette_func_t palette_func, void* closure)
{
    plutovg_rect_t extents = {0, 0, document->width, document->height};
    if(id && !plutosvg_document_extents(document, id, &extents))
        return NULL;
    if(extents.w <= 0.f || extents.h <= 0.f)
        return NULL;
    if(width <= 0 && height <= 0) {
        width = (int)(ceilf(extents.w));
        height = (int)(ceilf(extents.h));
    } else if(width > 0 && height <= 0) {
        height = (int)(ceilf(width * extents.h / extents.w));
    } else if(height > 0 && width <= 0) {
        width = (int)(ceilf(height * extents.w / extents.h));
    }

    plutovg_surface_t* surface = plutovg_surface_create(width, height);
    if(surface == NULL)
        return NULL;
    plutovg_canvas_t* canvas = plutovg_canvas_create(surface);
    plutovg_canvas_scale(canvas, width / extents.w, height / extents.h);
    plutovg_canvas_translate(canvas, -extents.x, -extents.y);
    if(!plutosvg_document_render(document, id, canvas, current_color, palette_func, closure)) {
        plutovg_canvas_destroy(canvas);
        plutovg_surface_destroy(surface);
        return NULL;
    }

    plutovg_canvas_destroy(canvas);
    return surface;
}